

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void tinygltf::SerializeGltfNode(Node *node,json *o)

{
  char cVar1;
  size_type sVar2;
  ulong uVar3;
  allocator local_1d9;
  string local_1d8;
  allocator local_1b1;
  string local_1b0;
  allocator local_189;
  string local_188;
  allocator local_161;
  string local_160;
  allocator local_139;
  string local_138;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  json *local_18;
  json *o_local;
  Node *node_local;
  
  local_18 = o;
  o_local = (json *)node;
  sVar2 = std::vector<double,_std::allocator<double>_>::size(&node->translation);
  if (sVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"translation",&local_39);
    SerializeNumberArrayProperty<double>
              (&local_38,(vector<double,_std::allocator<double>_> *)&o_local[7].m_value,local_18);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  sVar2 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)&o_local[4].m_value);
  if (sVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"rotation",&local_71);
    SerializeNumberArrayProperty<double>
              (&local_70,(vector<double,_std::allocator<double>_> *)&o_local[4].m_value,local_18);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  sVar2 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(o_local + 6));
  if (sVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"scale",&local_99);
    SerializeNumberArrayProperty<double>
              (&local_98,(vector<double,_std::allocator<double>_> *)(o_local + 6),local_18);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  sVar2 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(o_local + 9));
  if (sVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c0,"matrix",&local_c1);
    SerializeNumberArrayProperty<double>
              (&local_c0,(vector<double,_std::allocator<double>_> *)(o_local + 9),local_18);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  if (*(int *)((long)&o_local[2].m_value + 4) != -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e8,"mesh",&local_e9);
    SerializeNumberProperty<int>(&local_e8,*(int *)((long)&o_local[2].m_value + 4),local_18);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  }
  if (*(int *)&o_local[2].m_value != -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_110,"skin",&local_111);
    SerializeNumberProperty<int>(&local_110,*(int *)&o_local[2].m_value,local_18);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
  }
  if (*(int *)o_local != -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_138,"camera",&local_139);
    SerializeNumberProperty<int>(&local_138,*(int *)o_local,local_18);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  sVar2 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)&o_local[10].m_value);
  if (sVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_160,"weights",&local_161);
    SerializeNumberArrayProperty<double>
              (&local_160,(vector<double,_std::allocator<double>_> *)&o_local[10].m_value,local_18);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
  }
  cVar1 = Value::Type((Value *)(o_local + 0xf));
  if (cVar1 != '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_188,"extras",&local_189);
    SerializeValue(&local_188,(Value *)(o_local + 0xf),local_18);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
  }
  SerializeExtensionMap((ExtensionMap *)(o_local + 0xc),local_18);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b0,"name",&local_1b1);
    SerializeStringProperty(&local_1b0,(string *)&o_local->m_value,local_18);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d8,"children",&local_1d9);
  SerializeNumberArrayProperty<int>
            (&local_1d8,(vector<int,_std::allocator<int>_> *)(o_local + 3),local_18);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  return;
}

Assistant:

static void SerializeGltfNode(Node &node, json &o) {
  if (node.translation.size() > 0) {
    SerializeNumberArrayProperty<double>("translation", node.translation, o);
  }
  if (node.rotation.size() > 0) {
    SerializeNumberArrayProperty<double>("rotation", node.rotation, o);
  }
  if (node.scale.size() > 0) {
    SerializeNumberArrayProperty<double>("scale", node.scale, o);
  }
  if (node.matrix.size() > 0) {
    SerializeNumberArrayProperty<double>("matrix", node.matrix, o);
  }
  if (node.mesh != -1) {
    SerializeNumberProperty<int>("mesh", node.mesh, o);
  }

  if (node.skin != -1) {
    SerializeNumberProperty<int>("skin", node.skin, o);
  }

  if (node.camera != -1) {
    SerializeNumberProperty<int>("camera", node.camera, o);
  }

  if (node.weights.size() > 0) {
    SerializeNumberArrayProperty<double>("weights", node.weights, o);
  }

  if (node.extras.Type() != NULL_TYPE) {
    SerializeValue("extras", node.extras, o);
  }

  SerializeExtensionMap(node.extensions, o);
  if (!node.name.empty()) SerializeStringProperty("name", node.name, o);
  SerializeNumberArrayProperty<int>("children", node.children, o);
}